

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpDebugOut.c
# Opt level: O1

void printFmt(MessageType type,char *format,__va_list_tag *args)

{
  FILE *__s;
  undefined8 *puVar1;
  
  if (type != MESSAGETYPE_ERROR) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  __s = (FILE *)*puVar1;
  if (type == MESSAGETYPE_ERROR) {
    fwrite("FATAL ERROR: ",0xd,1,__s);
    vfprintf(__s,format,args);
    putc(10,__s);
    fflush(__s);
    return;
  }
  vfprintf(__s,format,args);
  return;
}

Assistant:

void printFmt (MessageType type, const char* format, va_list args)
{
	FILE* out = getOutFile(type);

	if (type == MESSAGETYPE_ERROR)
		fprintf(out, "FATAL ERROR: ");

	vfprintf(out, format, args);

	if (type == MESSAGETYPE_ERROR)
	{
		putc('\n', out);
		fflush(out);
	}
}